

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O3

TA_RetCode
TA_STOCH_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement
                )

{
  TA_ParamHolderInput *pTVar1;
  TA_ParamHolderOptInput *pTVar2;
  TA_RetCode TVar3;
  
  pTVar1 = params->in;
  pTVar2 = params->optIn;
  TVar3 = TA_STOCH(startIdx,endIdx,(pTVar1->data).inPrice.high,(pTVar1->data).inPrice.low,
                   (pTVar1->data).inPrice.close,(pTVar2->data).optInInteger,
                   pTVar2[1].data.optInInteger,pTVar2[2].data.optInInteger,
                   pTVar2[3].data.optInInteger,pTVar2[4].data.optInInteger,outBegIdx,outNBElement,
                   (params->out->data).outReal,params->out[1].data.outReal);
  return TVar3;
}

Assistant:

TA_RetCode TA_STOCH_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_STOCH(
/* Generated */               startIdx,
/* Generated */               endIdx,
/* Generated */               params->in[0].data.inPrice.high, /* inHigh */
/* Generated */               params->in[0].data.inPrice.low, /* inLow */
/* Generated */               params->in[0].data.inPrice.close, /* inClose */
/* Generated */               params->optIn[0].data.optInInteger, /* optInFastK_Period*/
/* Generated */               params->optIn[1].data.optInInteger, /* optInSlowK_Period*/
/* Generated */               (TA_MAType)params->optIn[2].data.optInInteger, /* optInSlowK_MAType*/
/* Generated */               params->optIn[3].data.optInInteger, /* optInSlowD_Period*/
/* Generated */               (TA_MAType)params->optIn[4].data.optInInteger, /* optInSlowD_MAType*/
/* Generated */               outBegIdx, 
/* Generated */               outNBElement, 
/* Generated */               params->out[0].data.outReal, /*  outSlowK */
/* Generated */               params->out[1].data.outReal /*  outSlowD */ );
/* Generated */ }